

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vsldb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint8_t reg;
  uint uVar1;
  int iVar2;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 dst_01;
  uintptr_t o_1;
  uintptr_t o_3;
  uintptr_t o_2;
  bool enr;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_i4,FLD_C_b4);
  dst = tcg_temp_new_i64(tcg_ctx);
  dst_00 = tcg_temp_new_i64(tcg_ctx);
  dst_01 = tcg_temp_new_i64(tcg_ctx);
  iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
  enr = (uVar1 & 8) != 0;
  if (enr) {
    read_vec_element_i64(tcg_ctx,dst,(uint8_t)iVar2,'\x01',MO_64);
    iVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
    reg = (uint8_t)iVar2;
  }
  else {
    read_vec_element_i64(tcg_ctx,dst,(uint8_t)iVar2,'\0',MO_64);
    iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
    reg = (uint8_t)iVar2;
  }
  read_vec_element_i64(tcg_ctx,dst_00,reg,!enr,MO_64);
  iVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
  read_vec_element_i64(tcg_ctx,dst_01,(uint8_t)iVar2,enr,MO_64);
  uVar1 = (uVar1 & 7) * -8 + 0x40;
  tcg_gen_extract2_i64_s390x(tcg_ctx,dst,dst_00,dst,uVar1);
  tcg_gen_extract2_i64_s390x(tcg_ctx,dst_00,dst_01,dst_00,uVar1);
  iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
  write_vec_element_i64(tcg_ctx,dst,iVar2,'\0',MO_64);
  iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
  write_vec_element_i64(tcg_ctx,dst_00,iVar2,'\x01',MO_64);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst_00 + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst_01 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vsldb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t i4 = get_field(s, i4) & 0xf;
    const int left_shift = (i4 & 7) * 8;
    const int right_shift = 64 - left_shift;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    if ((i4 & 8) == 0) {
        read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), 0, ES_64);
        read_vec_element_i64(tcg_ctx, t1, get_field(s, v2), 1, ES_64);
        read_vec_element_i64(tcg_ctx, t2, get_field(s, v3), 0, ES_64);
    } else {
        read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), 1, ES_64);
        read_vec_element_i64(tcg_ctx, t1, get_field(s, v3), 0, ES_64);
        read_vec_element_i64(tcg_ctx, t2, get_field(s, v3), 1, ES_64);
    }
    tcg_gen_extract2_i64(tcg_ctx, t0, t1, t0, right_shift);
    tcg_gen_extract2_i64(tcg_ctx, t1, t2, t1, right_shift);
    write_vec_element_i64(tcg_ctx, t0, get_field(s, v1), 0, ES_64);
    write_vec_element_i64(tcg_ctx, t1, get_field(s, v1), 1, ES_64);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    return DISAS_NEXT;
}